

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cc
# Opt level: O0

void __thiscall
iqxmlrpc::http::Header::register_validator
          (Header *this,string *name,Option_validator_fn *fn,Verification_level level)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::http::Header::Option_validator>
  local_98;
  undefined1 local_50 [8];
  Option_validator v;
  Verification_level level_local;
  Option_validator_fn *fn_local;
  string *name_local;
  Header *this_local;
  
  local_50._0_4_ = level;
  v.fn.
  super_function1<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .super_function_base.functor._20_4_ = level;
  boost::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&v,fn);
  std::make_pair<std::__cxx11::string_const&,iqxmlrpc::http::Header::Option_validator&>
            (&local_98,name,(Option_validator *)local_50);
  std::
  multimap<std::__cxx11::string,iqxmlrpc::http::Header::Option_validator,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,iqxmlrpc::http::Header::Option_validator>>>
  ::insert<std::pair<std::__cxx11::string,iqxmlrpc::http::Header::Option_validator>>
            ((multimap<std::__cxx11::string,iqxmlrpc::http::Header::Option_validator,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,iqxmlrpc::http::Header::Option_validator>>>
              *)&this->validators_,&local_98);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::http::Header::Option_validator>
  ::~pair(&local_98);
  Option_validator::~Option_validator((Option_validator *)local_50);
  return;
}

Assistant:

void Header::register_validator(
  const std::string& name,
  Header::Option_validator_fn fn,
  Verification_level level)
{
  Option_validator v = { level, fn };
  validators_.insert(std::make_pair(name, v));
}